

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O2

ostream * operator<<(ostream *outputStream,Array *arr)

{
  int iVar1;
  ostream *poVar2;
  int i;
  uint index;
  
  for (index = 0; (int)index < arr->theSize; index = index + 1) {
    iVar1 = Array::operator[](arr,index);
    poVar2 = (ostream *)std::ostream::operator<<(outputStream,iVar1);
    std::operator<<(poVar2," ");
  }
  return outputStream;
}

Assistant:

ostream &operator<<(ostream &outputStream, Array &arr) {
    for (int i = 0; i < arr.theSize; i++)
        outputStream << arr[i] << " ";
    return outputStream;
}